

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
Imf_2_5::CompositeDeepScanLine::readPixels(CompositeDeepScanLine *this,int start,int end)

{
  int iVar1;
  pointer puVar2;
  Header *pHVar3;
  Data *pDVar4;
  pointer ppDVar5;
  pointer ppDVar6;
  Task *this_00;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_type sVar11;
  Header *in_R8;
  pointer pvVar12;
  ulong uVar13;
  size_type __n;
  int iVar14;
  ulong uVar15;
  long lVar16;
  TaskGroup g;
  vector<const_char_*,_std::allocator<const_char_*>_> names;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  samples;
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_sources;
  vector<unsigned_int,_std::allocator<unsigned_int>_> total_sizes;
  vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_> headers;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  pointers;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_> framebuffers;
  allocator_type local_f8 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> local_f0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_> local_90;
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  local_78;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60;
  vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_> local_48;
  
  pDVar4 = this->_Data;
  uVar13 = ((long)(pDVar4->_part).
                  super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pDVar4->_part).
                  super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) +
           ((long)(pDVar4->_file).
                  super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pDVar4->_file).
                  super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::vector
            (&local_48,uVar13,(allocator_type *)&local_60);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_60,uVar13,(allocator_type *)&local_78);
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::vector(&local_78,uVar13,(allocator_type *)&local_90);
  std::vector<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>::vector
            (&local_90,uVar13,(allocator_type *)&local_a8);
  ppDVar5 = (this->_Data->_file).
            super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_Data->_file).
      super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppDVar5) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    do {
      pHVar3 = DeepScanLineInputFile::header(ppDVar5[uVar15]);
      local_90.super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar15] = pHVar3;
      uVar15 = uVar15 + 1;
      ppDVar5 = (this->_Data->_file).
                super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(this->_Data->_file).
                                    super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar5 >> 3)
            );
  }
  ppDVar6 = (this->_Data->_part).
            super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_Data->_part).
      super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppDVar6) {
    uVar8 = 0;
    do {
      pHVar3 = DeepScanLineInputPart::header(ppDVar6[uVar8]);
      local_90.super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar15 + uVar8] = pHVar3;
      uVar8 = uVar8 + 1;
      ppDVar6 = (this->_Data->_part).
                super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->_Data->_part).
                                   super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar6 >> 3))
    ;
  }
  if (uVar13 != 0) {
    lVar16 = 0;
    lVar9 = 0;
    uVar15 = uVar13;
    do {
      Data::handleDeepFrameBuffer
                (this->_Data,
                 (DeepFrameBuffer *)
                 (&((local_48.
                     super__Vector_base<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 +
                 lVar9),(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        ((long)&((local_60.
                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar16),
                 (vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                  *)((long)&((local_78.
                              super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar16),in_R8,start,end);
      lVar9 = lVar9 + 0x68;
      lVar16 = lVar16 + 0x18;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  ppDVar5 = (this->_Data->_file).
            super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_Data->_file).
      super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppDVar5) {
    uVar15 = 0;
  }
  else {
    lVar9 = 0;
    uVar15 = 0;
    do {
      DeepScanLineInputFile::setFrameBuffer
                (ppDVar5[uVar15],
                 (DeepFrameBuffer *)
                 (&((local_48.
                     super__Vector_base<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 +
                 lVar9));
      DeepScanLineInputFile::readPixelSampleCounts
                ((this->_Data->_file).
                 super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15],start,end);
      uVar15 = uVar15 + 1;
      ppDVar5 = (this->_Data->_file).
                super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x68;
    } while (uVar15 < (ulong)((long)(this->_Data->_file).
                                    super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar5 >> 3)
            );
  }
  pDVar4 = this->_Data;
  ppDVar6 = (pDVar4->_part).
            super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pDVar4->_part).
      super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppDVar6) {
    lVar9 = uVar15 * 0x68;
    uVar15 = 0;
    do {
      DeepScanLineInputPart::setFrameBuffer
                (ppDVar6[uVar15],
                 (DeepFrameBuffer *)
                 (&((local_48.
                     super__Vector_base<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl.field_0x0 +
                 lVar9));
      DeepScanLineInputPart::readPixelSampleCounts
                ((this->_Data->_part).
                 super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15],start,end);
      uVar15 = uVar15 + 1;
      pDVar4 = this->_Data;
      ppDVar6 = (pDVar4->_part).
                super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x68;
    } while (uVar15 < (ulong)((long)(pDVar4->_part).
                                    super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar6 >> 3)
            );
  }
  iVar14 = (pDVar4->_dataWindow).max.x;
  iVar1 = (pDVar4->_dataWindow).min.x;
  lVar9 = (long)((iVar14 - iVar1) + 1);
  if ((pDVar4->_dataWindow).max.y < (pDVar4->_dataWindow).min.y) {
    lVar9 = 1;
  }
  if (iVar14 < iVar1) {
    lVar9 = 1;
  }
  __n = ((end - start) + 1) * lVar9;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_a8,__n,(allocator_type *)&local_c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0,__n,(allocator_type *)&local_d8);
  if (__n == 0) {
    uVar15 = 0;
  }
  else {
    sVar11 = 0;
    uVar15 = 0;
    do {
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar11] = 0;
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[sVar11] = 0;
      pvVar12 = local_60.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (uVar8 = uVar13; uVar8 != 0; uVar8 = uVar8 - 1) {
        puVar2 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar11] =
             local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[sVar11] + puVar2[sVar11];
        if (puVar2[sVar11] != 0) {
          local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[sVar11] =
               local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[sVar11] + 1;
        }
        pvVar12 = pvVar12 + 1;
      }
      uVar15 = uVar15 + local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[sVar11];
      sVar11 = sVar11 + 1;
    } while (sVar11 != __n);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&local_d8,
           (long)(this->_Data->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_Data->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_f0);
  pDVar4 = this->_Data;
  if ((pDVar4->_channels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar4->_channels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      if ((uVar8 != 1) || (pDVar4->_zback == true)) {
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)
                   ((long)&((local_d8.
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar9),uVar15);
      }
      pDVar4 = this->_Data;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x18;
    } while (uVar8 < (ulong)((long)(pDVar4->_channels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pDVar4->_channels).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_d8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      if (((uVar8 != 1) || (this->_Data->_zback == true)) &&
         (std::vector<float,_std::allocator<float>_>::resize
                    (local_d8.
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar8,uVar15), __n != 0)) {
        sVar11 = 0;
        uVar7 = 0;
        do {
          if ((uVar13 != 0) && (uVar7 < uVar15)) {
            uVar10 = 1;
            lVar9 = 0;
            do {
              *(pointer *)
               (*(long *)(*(long *)((long)&((local_78.
                                             super__Vector_base<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar9) +
                         uVar8 * 0x18) + sVar11 * 8) =
                   local_d8.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8].
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start + uVar7;
              uVar7 = *(uint *)(*(long *)((long)&((local_60.
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + lVar9)
                               + sVar11 * 4) + uVar7;
              if (uVar13 <= uVar10) break;
              uVar10 = uVar10 + 1;
              lVar9 = lVar9 + 0x18;
            } while (uVar7 < uVar15);
          }
          sVar11 = sVar11 + 1;
        } while (sVar11 != __n);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(((long)local_d8.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  ppDVar5 = (this->_Data->_file).
            super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_Data->_file).
      super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppDVar5) {
    uVar13 = 0;
    do {
      DeepScanLineInputFile::readPixels(ppDVar5[uVar13],start,end);
      uVar13 = uVar13 + 1;
      ppDVar5 = (this->_Data->_file).
                super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->_Data->_file).
                                    super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar5 >> 3)
            );
  }
  pDVar4 = this->_Data;
  ppDVar6 = (pDVar4->_part).
            super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pDVar4->_part).
      super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppDVar6) {
    uVar13 = 0;
    do {
      DeepScanLineInputPart::readPixels(ppDVar6[uVar13],start,end);
      uVar13 = uVar13 + 1;
      pDVar4 = this->_Data;
      ppDVar6 = (pDVar4->_part).
                super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(pDVar4->_part).
                                    super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar6 >> 3)
            );
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_f0,
             (long)(pDVar4->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pDVar4->_channels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,local_f8);
  if (local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar13 = 0;
    do {
      local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] =
           *(char **)((long)&(((this->_Data->_channels).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9
                     );
      uVar13 = uVar13 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar13 < (ulong)((long)local_f0.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_f0.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (this->_Data->_zback == false) {
    local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start[1] =
         *local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  }
  IlmThread_2_5::TaskGroup::TaskGroup((TaskGroup *)local_f8);
  if (start <= end) {
    iVar14 = start;
    do {
      this_00 = (Task *)operator_new(0x40);
      pDVar4 = this->_Data;
      IlmThread_2_5::Task::Task(this_00,(TaskGroup *)local_f8);
      *(undefined ***)this_00 = &PTR__Task_03160098;
      *(Data **)(this_00 + 0x10) = pDVar4;
      *(int *)(this_00 + 0x18) = iVar14;
      *(int *)(this_00 + 0x1c) = start;
      *(vector<const_char_*,_std::allocator<const_char_*>_> **)(this_00 + 0x20) = &local_f0;
      *(vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
        **)(this_00 + 0x28) = &local_78;
      *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(this_00 + 0x30) = &local_a8;
      *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(this_00 + 0x38) = &local_c0;
      IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
      iVar14 = iVar14 + 1;
    } while (end + 1 != iVar14);
  }
  IlmThread_2_5::TaskGroup::~TaskGroup((TaskGroup *)local_f8);
  if (local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_d8);
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<const_Imf_2_5::Header_*,_std::allocator<const_Imf_2_5::Header_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_60);
  std::vector<Imf_2_5::DeepFrameBuffer,_std::allocator<Imf_2_5::DeepFrameBuffer>_>::~vector
            (&local_48);
  return;
}

Assistant:

void
CompositeDeepScanLine::readPixels(int start, int end)
{
   size_t parts = _Data->_file.size() + _Data->_part.size(); // total of files+parts
   
   vector<DeepFrameBuffer> framebuffers(parts);
   vector< vector<unsigned int> > counts(parts);
   
   //
   // for each part, a pointer to an array of channels
   //
   vector<vector< vector<float *> > > pointers(parts);
   vector<const Header *> headers(parts);
   
   {
     size_t i;
     for(i=0;i<_Data->_file.size();i++)
     {
         headers[i] = &_Data->_file[i]->header();
     }
     
     for(size_t j=0;j<_Data->_part.size();j++)
     {
        headers[i+j] = &_Data->_part[j]->header();
     }
   }
   
   
   for(size_t i=0;i<parts;i++)
   {
     _Data->handleDeepFrameBuffer(framebuffers[i],counts[i],pointers[i],*headers[i],start,end);
   }
   
   //
   // set frame buffers and read scanlines from all parts
   // TODO what happens if SCANLINE not in data window?
   //
   
   {
       size_t i=0;
       for(i=0;i<_Data->_file.size();i++)
       {
            _Data->_file[i]->setFrameBuffer(framebuffers[i]);
            _Data->_file[i]->readPixelSampleCounts(start,end);
       }
       for(size_t j=0;j<_Data->_part.size();j++)
       {
           _Data->_part[j]->setFrameBuffer(framebuffers[i+j]);
           _Data->_part[j]->readPixelSampleCounts(start,end); 
       }
   }   
   
   
   //
   //  total width
   //
   
   size_t total_width = _Data->_dataWindow.size().x+1;
   size_t total_pixels = total_width*(end-start+1);
   vector<unsigned int> total_sizes(total_pixels);
   vector<unsigned int> num_sources(total_pixels); //number of parts with non-zero sample count
   
   size_t overall_sample_count=0; // sum of all samples in all images between start and end
   
   
   //
   // accumulate pixel counts
   //
   for(size_t ptr=0;ptr<total_pixels;ptr++)
   {
       total_sizes[ptr]=0;
       num_sources[ptr]=0;
       for(size_t j=0;j<parts;j++)
       {
          total_sizes[ptr]+=counts[j][ptr];
          if(counts[j][ptr]>0) num_sources[ptr]++;
       }
       overall_sample_count+=total_sizes[ptr];
       
       
       
   }
   
  
  
   
   //
   // allocate arrays for pixel data
   // samples array accessed as in pixels[channel][sample]
   //
   
   vector<vector<float> > samples( _Data->_channels.size() );
   
   for(size_t channel=0;channel<_Data->_channels.size();channel++)
   {
       if( channel!=1 || _Data->_zback)
       {            
           samples[channel].resize(overall_sample_count);
       }
   }
   
   for(size_t channel=0;channel<samples.size();channel++)
   {
       
       if( channel!=1 || _Data->_zback)
       {
           
           samples[channel].resize(overall_sample_count);
       
       
          //
          // allocate pointers for channel data
          //
          
          size_t offset=0;
       
          for(size_t pixel=0;pixel<total_pixels;pixel++)
          {
              for(size_t part=0 ; part<parts && offset<overall_sample_count ; part++ )
              {
                      pointers[part][channel][pixel]=&samples[channel][offset];           
                      offset+=counts[part][pixel];
              }
          }
       
       }
   }
   
   //
   // read data
   //
   
   for(size_t i=0;i<_Data->_file.size();i++)
   {
       _Data->_file[i]->readPixels(start,end);
   }
   for(size_t j=0;j<_Data->_part.size();j++)
   {
       _Data->_part[j]->readPixels(start,end); 
   }
   
   
   
   
   //
   // composite pixels and write back to framebuffer
  //
   
   
   // turn vector of strings into array of char *
   // and make sure 'ZBack' channel is correct
   vector<const char *> names(_Data->_channels.size());
   for(size_t i=0;i<names.size();i++)
   {
       names[i]=_Data->_channels[i].c_str();
   }
   
   if(!_Data->_zback) names[1]=names[0]; // no zback channel, so make it point to z

   
   
   TaskGroup g;
   for(int y=start;y<=end;y++)
   {
       ThreadPool::addGlobalTask(new LineCompositeTask(&g,_Data,y,start,&names,&pointers,&total_sizes,&num_sources));
   }//next row
}